

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  int iVar1;
  pointer pnVar2;
  pointer pnVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  pointer pIVar7;
  DataKey DVar8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  pointer pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  devexpr *pdVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  uint *puVar15;
  pointer keys;
  long lVar16;
  ulong uVar17;
  byte bVar18;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [13];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  undefined1 local_2b4 [20];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [13];
  undefined3 uStack_243;
  int iStack_240;
  bool bStack_23c;
  undefined8 local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  local_2c0._0_4_ = cpp_dec_float_finite;
  local_2c0._4_4_ = 0x1c;
  local_338 = (undefined1  [16])0x0;
  local_328 = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = false;
  pSVar9 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar9->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar9->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_238._0_4_ = cpp_dec_float_finite;
  local_238._4_4_ = 0x1c;
  local_2b4._4_16_ = (undefined1  [16])0x0;
  local_2a0 = (undefined1  [16])0x0;
  local_290 = (undefined1  [16])0x0;
  local_280 = (undefined1  [16])0x0;
  local_270 = (undefined1  [16])0x0;
  local_260 = (undefined1  [16])0x0;
  local_250 = SUB1613((undefined1  [16])0x0,0);
  uStack_243 = 0;
  iStack_240 = 0;
  bStack_23c = false;
  pIVar7 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar7) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar7;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  lVar16 = (long)(pSVar9->infeasibilities).super_IdxSet.num;
  keys = pIVar7;
  if (0 < lVar16) {
    uVar17 = lVar16 + 1;
    do {
      pSVar9 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar6 = (pSVar9->infeasibilities).super_IdxSet.idx;
      iVar1 = piVar6[uVar17 - 2];
      pnVar11 = pnVar2 + iVar1;
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_338;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar10->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar18 * -8 + 4);
      }
      iStack_2c8 = pnVar2[iVar1].m_backend.exp;
      bStack_2c4 = pnVar2[iVar1].m_backend.neg;
      local_2c0._0_4_ = pnVar2[iVar1].m_backend.fpclass;
      local_2c0._4_4_ = pnVar2[iVar1].m_backend.prec_elem;
      pnVar12 = feastol;
      pcVar10 = &result.m_backend;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pcVar10->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar18 * -8 + 4);
      }
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      if (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      if ((fpclass_type)local_2c0 == cpp_dec_float_NaN ||
          result.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_005a0b52:
        iVar4 = (pSVar9->infeasibilities).super_IdxSet.num;
        (pSVar9->infeasibilities).super_IdxSet.num = iVar4 + -1;
        piVar6[uVar17 - 2] = piVar6[(long)iVar4 + -1];
        (pSVar9->isInfeasible).data[iVar1] = 0;
      }
      else {
        iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_338,&result.m_backend);
        pSVar9 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        if (-1 < iVar4) {
          piVar6 = (pSVar9->infeasibilities).super_IdxSet.idx;
          goto LAB_005a0b52;
        }
        (pSVar9->isInfeasible).data[iVar1] = 1;
        local_2b4._0_4_ = iVar1;
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_338;
        pdVar13 = local_b0;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          *(uint *)pdVar13 = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar18 * -8 + 4);
          pdVar13 = pdVar13 + (ulong)bVar18 * -8 + 4;
        }
        local_40 = iStack_2c8;
        local_3c = bStack_2c4;
        local_38 = (fpclass_type)local_2c0;
        iStack_34 = local_2c0._4_4_;
        pnVar11 = pnVar3 + iVar1;
        pnVar12 = &local_130;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar3[iVar1].m_backend.exp;
        local_130.m_backend.neg = pnVar3[iVar1].m_backend.neg;
        local_130.m_backend.fpclass = pnVar3[iVar1].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar3[iVar1].m_backend.prec_elem;
        pnVar12 = feastol;
        pnVar14 = &local_1b0;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_b0,&local_130,&local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0);
        pnVar12 = &result;
        puVar15 = (uint *)(local_2b4 + 4);
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          *puVar15 = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
          puVar15 = puVar15 + (ulong)bVar18 * -2 + 1;
        }
        iStack_240 = result.m_backend.exp;
        bStack_23c = result.m_backend.neg;
        local_238._0_4_ = result.m_backend.fpclass;
        local_238._4_4_ = result.m_backend.prec_elem;
        std::
        vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
        ::push_back(&(this->prices).data,(value_type *)local_2b4);
      }
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
    keys = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pIVar7 = (this->prices).data.
             super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  DVar8.info = 0;
  DVar8.idx = -1;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  uVar5 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    (keys,&(this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).compare,0,(int)((ulong)((long)pIVar7 - (long)keys) >> 2) * 0x3e0f83e1,
                     100,0,0,true);
  if (0 < (int)uVar5) {
    pIVar7 = (this->prices).data.
             super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      DIdxSet::addIdx(&this->bestPrices,*(int *)((long)&(pIVar7->val).m_backend + lVar16 + -4));
      pIVar7 = (this->prices).data.
               super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (((this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thesolver)->isInfeasible).data[*(int *)((long)&(pIVar7->val).m_backend + lVar16 + -4)] = 2
      ;
      lVar16 = lVar16 + 0x84;
    } while ((ulong)uVar5 * 0x84 != lVar16);
    if (0 < (int)uVar5) {
      pIVar7 = (this->prices).data.
               super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = &pIVar7->val;
      pnVar14 = best;
      for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      (best->m_backend).exp = *(int *)((long)&(pIVar7->val).m_backend + 0x70);
      (best->m_backend).neg = *(bool *)((long)&(pIVar7->val).m_backend + 0x74);
      *(undefined8 *)&(best->m_backend).fpclass =
           *(undefined8 *)((long)&(pIVar7->val).m_backend + 0x78);
      DVar8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::coId((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver,
                              ((this->prices).data.
                               super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                               ._M_impl.super__Vector_impl_data._M_start)->idx);
    }
  }
  return (SPxId)DVar8;
}

Assistant:

SPxId SPxDevexPR<R>::buildBestPriceVectorEnterDim(R& best, R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* coTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -feastol)
      {
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(x, cpen[idx], feastol);
         prices.append(price);
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = prices[0].val;
      return this->thesolver->coId(prices[0].idx);
   }
   else
      return SPxId();
}